

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O1

void __thiscall adios2::core::engine::BP3Writer::EndStep(BP3Writer *this)

{
  _func_int *p_Var1;
  int iVar2;
  ScopedTimer __var294;
  ScopedTimer local_10;
  
  if (EndStep()::__var94 == '\0') {
    iVar2 = __cxa_guard_acquire(&EndStep()::__var94);
    if (iVar2 != 0) {
      EndStep::__var94 = (void *)ps_timer_create_("BP3Writer::EndStep");
      __cxa_guard_release(&EndStep()::__var94);
    }
  }
  local_10.m_timer = EndStep::__var94;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  if (*(long *)((this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3] + 0x390 +
               (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base) != 0) {
    PerformPuts(this);
  }
  adios2::format::BPSerializer::SerializeData
            ((BPSerializer *)&(this->m_BP3Serializer).super_BP3Base.field_0x8,
             (this->super_Engine).m_IO,true);
  p_Var1 = (this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3];
  if (*(ulong *)(p_Var1 + 0x1d8 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base) %
      *(ulong *)(p_Var1 + 0x200 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base) == 0)
  {
    Flush(this,-1);
  }
  if (*(int *)((this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3] + 0x10 +
              (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base) == 0) {
    ADIOS::RecordOutputStep
              (((this->super_Engine).m_IO)->m_ADIOS,&(this->super_Engine).m_Name,0xffffffffffffffff,
               INFINITY);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_10);
  return;
}

Assistant:

void BP3Writer::EndStep()
{
    PERFSTUBS_SCOPED_TIMER("BP3Writer::EndStep");
    if (m_BP3Serializer.m_DeferredVariables.size() > 0)
    {
        PerformPuts();
    }

    // true: advances step
    m_BP3Serializer.SerializeData(m_IO, true);

    const size_t currentStep = CurrentStep();
    const size_t flushStepsCount = m_BP3Serializer.m_Parameters.FlushStepsCount;

    if (currentStep % flushStepsCount == 0)
    {
        Flush();
    }

    if (m_BP3Serializer.m_RankMPI == 0)
    {
        m_IO.m_ADIOS.RecordOutputStep(m_Name, UnknownStep, UnknownTime);
    }
}